

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O0

int __thiscall TokenPipeEnd::TokenRead(TokenPipeEnd *this)

{
  ssize_t sVar1;
  int *piVar2;
  int *in_RDI;
  long in_FS_OFFSET;
  ssize_t result;
  uint8_t token;
  uint local_10;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    sVar1 = ::read(*in_RDI,&local_9,1);
    if (-1 < sVar1) {
      if (sVar1 == 0) {
        local_10 = 0xfffffffe;
      }
      else {
        local_10 = (uint)local_9;
      }
      goto LAB_01b0654d;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_10 = 0xffffffff;
LAB_01b0654d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

int TokenPipeEnd::TokenRead()
{
    uint8_t token;
    while (true) {
        ssize_t result = read(m_fd, &token, 1);
        if (result < 0) {
            // Failure. Check if the read was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return token;
        }
    }
    return token;
}